

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

ON_MeshNgon *
ON_MeshNgon::NgonFromMeshFace(ON_MeshNgonBuffer *ngon_buffer,uint mesh_face_index,uint *fvi)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ON__UINT_PTR OVar4;
  bool bVar5;
  uint uVar6;
  
  bVar5 = ON_IsNullPtr(ngon_buffer);
  if (fvi == (uint *)0x0 || bVar5) {
    ngon_buffer = (ON_MeshNgonBuffer *)0x0;
  }
  else {
    uVar2 = fvi[2];
    uVar3 = fvi[3];
    uVar6 = (uVar3 != uVar2 && uVar3 != 0xffffffff) + 3;
    ngon_buffer->m_ngon_buffer[1] = (ON__UINT_PTR)(ngon_buffer->m_ngon_buffer + 3);
    puVar1 = (uint *)((long)ngon_buffer->m_ngon_buffer + (ulong)uVar6 * 4 + 0x18);
    ngon_buffer->m_ngon_buffer[2] = (ON__UINT_PTR)puVar1;
    OVar4 = *(ON__UINT_PTR *)fvi;
    *(uint *)ngon_buffer->m_ngon_buffer = uVar6;
    ngon_buffer->m_ngon_buffer[3] = OVar4;
    *(uint *)(ngon_buffer->m_ngon_buffer + 4) = uVar2;
    if (uVar3 != uVar2 && uVar3 != 0xffffffff) {
      *(uint *)((long)ngon_buffer->m_ngon_buffer + 0x24) = uVar3;
    }
    *(undefined4 *)((long)ngon_buffer->m_ngon_buffer + 4) = 1;
    *puVar1 = mesh_face_index;
  }
  return (ON_MeshNgon *)ngon_buffer;
}

Assistant:

class ON_MeshNgon* ON_MeshNgon::NgonFromMeshFace(
  class ON_MeshNgonBuffer& ngon_buffer,
  unsigned int mesh_face_index,
  const unsigned int* fvi
  )
{
  // The nullptr check is weird.
  // Speculation: There is / was some way that a null reference (like a * of a bona fide nullptr)
  // was in use?
  if ( ON_IsNullPtr(&ngon_buffer) || 0 == fvi )
    return 0;

  // local_fvi[] allows the fvi[] input to be stored in the buffer[] memory.
  unsigned int local_fvi[4] = {fvi[0],fvi[1],fvi[2],fvi[3]};
  fvi = local_fvi;

  unsigned int Vcount = (fvi[3] < ON_UNSET_UINT_INDEX && fvi[3] != fvi[2]) ? 4 : 3;

  ON_MeshNgon* ngon = (ON_MeshNgon*)(&ngon_buffer);
  ngon->m_vi = (unsigned int*)(ngon+1);
  ngon->m_fi = ngon->m_vi + Vcount;

  ngon->m_Vcount = Vcount;
  ngon->m_vi[0] = fvi[0];
  ngon->m_vi[1] = fvi[1];
  ngon->m_vi[2] = fvi[2];
  if ( 4 == ngon->m_Vcount )
    ngon->m_vi[3] = fvi[3];

  ngon->m_Fcount = 1;
  ngon->m_fi[0] = mesh_face_index;

  return ngon;
}